

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_enc.c
# Opt level: O2

void VP8WriteProbas(VP8BitWriter *bw,VP8EncProba *probas)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ProbaArray (*paaauVar6) [8];
  ProbaArray (*paaauVar7) [8];
  long lVar8;
  long lVar9;
  long lVar10;
  long local_70;
  ProbaArray (*local_68) [8];
  
  local_68 = probas->coeffs_;
  local_70 = 0;
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    paaauVar6 = local_68;
    lVar9 = local_70;
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
      paaauVar7 = paaauVar6;
      lVar8 = lVar9;
      for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
        for (lVar10 = 0; lVar10 != 0xb; lVar10 = lVar10 + 1) {
          bVar1 = (*paaauVar7)[0][0][lVar10];
          iVar2 = VP8PutBit(bw,(uint)(bVar1 != VP8CoeffsProba0[0][0][0][lVar10 + lVar8]),
                            (uint)VP8CoeffsUpdateProba[0][0][0][lVar10 + lVar8]);
          if (iVar2 != 0) {
            VP8PutBits(bw,(uint)bVar1,8);
          }
        }
        paaauVar7 = (ProbaArray (*) [8])((*paaauVar7)[0] + 1);
        lVar8 = lVar8 + 0xb;
      }
      paaauVar6 = (ProbaArray (*) [8])(*paaauVar6 + 1);
      lVar9 = lVar9 + 0x21;
    }
    local_68 = local_68 + 1;
    local_70 = local_70 + 0x108;
  }
  iVar2 = VP8PutBitUniform(bw,probas->use_skip_proba_);
  if (iVar2 != 0) {
    VP8PutBits(bw,(uint)probas->skip_proba_,8);
    return;
  }
  return;
}

Assistant:

void VP8WriteProbas(VP8BitWriter* const bw, const VP8EncProba* const probas) {
  int t, b, c, p;
  for (t = 0; t < NUM_TYPES; ++t) {
    for (b = 0; b < NUM_BANDS; ++b) {
      for (c = 0; c < NUM_CTX; ++c) {
        for (p = 0; p < NUM_PROBAS; ++p) {
          const uint8_t p0 = probas->coeffs_[t][b][c][p];
          const int update = (p0 != VP8CoeffsProba0[t][b][c][p]);
          if (VP8PutBit(bw, update, VP8CoeffsUpdateProba[t][b][c][p])) {
            VP8PutBits(bw, p0, 8);
          }
        }
      }
    }
  }
  if (VP8PutBitUniform(bw, probas->use_skip_proba_)) {
    VP8PutBits(bw, probas->skip_proba_, 8);
  }
}